

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgcrd(fitsfile *fptr,char *name,char *card,int *status)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  undefined4 extraout_var;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  int local_12c;
  int match;
  int cardlen;
  int nextkey;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  int exact;
  int nkeys;
  char keyname [75];
  char cardname [75];
  
  if (0 < *status) {
    return *status;
  }
  keyname[0] = '\0';
  pcVar12 = name + -1;
  do {
    pcVar13 = pcVar12 + 1;
    pcVar12 = pcVar12 + 1;
  } while (*pcVar13 == ' ');
  pcVar13 = keyname;
  strncat(pcVar13,pcVar12,0x4a);
  sVar6 = strlen(pcVar13);
  uVar15 = (uint)sVar6;
  uVar10 = sVar6 & 0xffffffff;
  uVar14 = (ulong)(uVar15 + 1);
  do {
    if ((int)uVar10 < 1) {
      uVar14 = (ulong)((int)uVar15 >> 0x1f & uVar15);
      break;
    }
    uVar14 = (ulong)((int)uVar14 - 1);
    lVar4 = uVar10 - 1;
    uVar10 = uVar10 - 1;
  } while (keyname[lVar4] == ' ');
  iVar16 = (int)uVar14;
  keyname[iVar16] = '\0';
  uVar9 = 0;
  uVar10 = 0;
  if (0 < iVar16) {
    uVar10 = uVar14;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pp_Var7 = __ctype_toupper_loc();
    keyname[uVar9] = (char)(*pp_Var7)[keyname[uVar9]];
  }
  if ((keyname[0] == 'H') && (CONCAT71(keyname._1_7_,0x48) == 0x4843524152454948)) {
    if (iVar16 != 8) {
      pcVar12 = keyname + 8;
      do {
        cVar8 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while (cVar8 == ' ');
      uVar14 = 0;
      while (cVar8 != '\0') {
        *pcVar13 = cVar8;
        pcVar13 = pcVar13 + 1;
        pcVar1 = pcVar12 + uVar14;
        uVar14 = uVar14 + 1;
        cVar8 = *pcVar1;
      }
      *pcVar13 = '\0';
      goto LAB_001a7637;
    }
    uVar14 = 8;
    bVar3 = false;
LAB_001a7648:
    pcVar12 = strchr(keyname,0x3f);
    bVar2 = true;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = strchr(keyname,0x2a);
      if (pcVar12 != (char *)0x0) {
        local_12c = (int)uVar14 + -2;
        bVar17 = false;
        goto LAB_001a7681;
      }
      pcVar12 = strchr(keyname,0x23);
      bVar17 = pcVar12 == (char *)0x0;
      bVar2 = !bVar17;
    }
    else {
      bVar17 = false;
      bVar2 = true;
    }
  }
  else {
LAB_001a7637:
    bVar3 = true;
    if ((int)uVar14 < 9) goto LAB_001a7648;
    bVar2 = false;
    bVar17 = true;
  }
  local_12c = (int)uVar14;
LAB_001a7681:
  ffghps(fptr,&nkeys,&nextkey,status);
  uVar10 = 2;
  if (2 < (int)uVar14) {
    uVar10 = uVar14;
  }
  local_f0 = (ulong)((int)uVar10 - 1);
  iVar16 = (nkeys - nextkey) + 1;
  local_f8 = 0;
  local_e8 = uVar14;
  do {
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    for (iVar11 = 0; iVar11 != iVar16; iVar11 = iVar11 + 1) {
      ffgnky(fptr,card,status);
      if (bVar3) {
        ffgknm(card,cardname,&cardlen,status);
        iVar5 = cardlen;
        if (!(bool)(cardlen != (int)local_e8 & bVar17) && local_12c <= cardlen) {
          uVar10 = 0;
          if (0 < cardlen) {
            uVar10 = (ulong)(uint)cardlen;
          }
          for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
            cVar8 = cardname[uVar14];
            if (0x60 < (long)cVar8) {
              pp_Var7 = __ctype_toupper_loc();
              cardname[uVar14] = (char)(*pp_Var7)[cVar8];
            }
          }
          if (bVar17) {
            if (keyname[local_f0] == cardname[local_f0]) {
              if (keyname[0] == cardname[0]) {
                pcVar12 = keyname;
                sVar6 = local_f0;
                pcVar13 = cardname;
                goto LAB_001a777f;
              }
            }
            else if (iVar5 == 0 && (int)local_e8 == 0) goto LAB_001a784f;
          }
          else {
            ffcmps(keyname,cardname,1,&match,&exact);
            if (match != 0) goto LAB_001a784f;
          }
        }
      }
      else if (*card == 'H') {
        pcVar12 = "HIERARCH";
        sVar6 = 8;
        pcVar13 = card;
LAB_001a777f:
        iVar5 = strncmp(pcVar12,pcVar13,sVar6);
        if (iVar5 == 0) {
LAB_001a784f:
          return *status;
        }
      }
    }
    if ((local_f8 & 1) != 0 || bVar2) {
      *status = 0xca;
      return 0xca;
    }
    iVar11 = ffmaky(fptr,1,status);
    iVar16 = nextkey + -1;
    local_f8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar11) >> 8),1);
  } while( true );
}

Assistant:

int ffgcrd( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *name,         /* I - name of keyword to read  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the entire keyword card up to
  80 characters long.  
  The returned card value is null terminated with any trailing blank 
  characters removed.

  If the input name contains wild cards ('?' matches any single char
  and '*' matches any sequence of chars, # matches any string of decimal
  digits) then the search ends once the end of header is reached and does 
  not automatically resume from the top of the header.
*/
{
    int nkeys, nextkey, ntodo, namelen, namelen_limit, namelenminus1, cardlen;
    int ii = 0, jj, kk, wild, match, exact, hier = 0;
    char keyname[FLEN_KEYWORD], cardname[FLEN_KEYWORD];
    char *ptr1, *ptr2, *gotstar;

    if (*status > 0)
        return(*status);

    *keyname = '\0';
    
    while (name[ii] == ' ')  /* skip leading blanks in name */
        ii++;

    strncat(keyname, &name[ii], FLEN_KEYWORD - 1);

    namelen = strlen(keyname);

    while (namelen > 0 && keyname[namelen - 1] == ' ')
         namelen--;            /* ignore trailing blanks in name */

    keyname[namelen] = '\0';  /* terminate the name */

    for (ii=0; ii < namelen; ii++)       
        keyname[ii] = toupper(keyname[ii]);    /*  make upper case  */

    if (FSTRNCMP("HIERARCH", keyname, 8) == 0)
    {
        if (namelen == 8)
        {
            /* special case: just looking for any HIERARCH keyword */
            hier = 1;
        }
        else
        {
            /* ignore the leading HIERARCH and look for the 'real' name */
            /* starting with first non-blank character following HIERARCH */
            ptr1 = keyname;
            ptr2 = &keyname[8];

            while(*ptr2 == ' ')
                ptr2++;

            namelen = 0;
            while(*ptr2)
            {
                *ptr1 = *ptr2;
                 ptr1++;
                 ptr2++;
                 namelen++;
            }
            *ptr1 = '\0';
        }
    }

    /* does input name contain wild card chars?  ('?',  '*', or '#') */
    /* wild cards are currently not supported with HIERARCH keywords */

    namelen_limit = namelen;
    gotstar = 0;
    if (namelen < 9 && 
       (strchr(keyname,'?') || (gotstar = strchr(keyname,'*')) || 
        strchr(keyname,'#')) )
    {
        wild = 1;

        /* if we found a '*' wild card in the name, there might be */
        /* more than one.  Support up to 2 '*' in the template. */
        /* Thus we need to compare keywords whose names have at least */
        /* namelen - 2 characters.                                   */
        if (gotstar)
           namelen_limit -= 2;           
    }
    else
        wild = 0;

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */

    namelenminus1 = maxvalue(namelen - 1, 1);
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */
    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */

        if (hier)
        {
           if (FSTRNCMP("HIERARCH", card, 8) == 0)
                return(*status);  /* found a HIERARCH keyword */
        }
        else
        {
          ffgknm(card, cardname, &cardlen, status); /* get the keyword name */

          if (cardlen >= namelen_limit)  /* can't match if card < name */
          { 
            /* if there are no wild cards, lengths must be the same */
            if (!( !wild && cardlen != namelen) )
            {
              for (ii=0; ii < cardlen; ii++)
              {    
                /* make sure keyword is in uppercase */
                if (cardname[ii] > 96)
                {
                  /* This assumes the ASCII character set in which */
                  /* upper case characters start at ASCII(97)  */
                  /* Timing tests showed that this is 20% faster */
                  /* than calling the isupper function.          */

                  cardname[ii] = toupper(cardname[ii]);  /* make upper case */
                }
              }

              if (wild)
              {
                ffcmps(keyname, cardname, 1, &match, &exact);
                if (match)
                    return(*status); /* found a matching keyword */
              }
              else if (keyname[namelenminus1] == cardname[namelenminus1])
              {
                /* test the last character of the keyword name first, on */
                /* the theory that it is less likely to match then the first */
                /* character since many keywords begin with 'T', for example */

                if (FSTRNCMP(keyname, cardname, namelenminus1) == 0)
                {
                  return(*status);   /* found the matching keyword */
                }
              }
	      else if (namelen == 0 && cardlen == 0)
	      {
	         /* matched a blank keyword */
		 return(*status);
	      }
            }
          }
        }
      }

      if (wild || jj == 1)
            break;  /* stop at end of header if template contains wildcards */

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}